

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::MultiReporter::benchmarkStarting(MultiReporter *this,BenchmarkInfo *benchmarkInfo)

{
  pointer puVar1;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer puVar2;
  
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_reporterLikes).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*puVar2->m_ptr->_vptr_IEventListener[9])(puVar2->m_ptr,benchmarkInfo);
  }
  return;
}

Assistant:

void MultiReporter::benchmarkStarting( BenchmarkInfo const& benchmarkInfo ) {
        for ( auto& reporterish : m_reporterLikes ) {
            reporterish->benchmarkStarting( benchmarkInfo );
        }
    }